

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svlogd.c
# Opt level: O2

int buffer_pwrite(int n,char *s,uint len)

{
  unsigned_long uVar1;
  logdir *plVar2;
  int iVar3;
  uint uVar4;
  ssize_t sVar5;
  int *piVar6;
  DIR *__dirp;
  dirent *pdVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  char *s_00;
  uint local_6c;
  char oldest [30];
  
  uVar8 = dir[n].sizemax;
  uVar10 = len;
  if (uVar8 != 0) {
    uVar9 = dir[n].size;
    if (uVar8 <= uVar9) {
      rotate(dir + n);
      uVar9 = dir[n].size;
      uVar8 = dir[n].sizemax;
    }
    uVar10 = (uint)(uVar8 - uVar9);
    if ((ulong)len <= uVar8 - uVar9) {
      uVar10 = len;
    }
  }
LAB_00103f66:
  sVar5 = write(dir[n].fdcur,s,(ulong)uVar10);
  plVar2 = dir;
  iVar3 = (int)sVar5;
  if (iVar3 != -1) {
    uVar8 = (long)iVar3 + dir[n].size;
    dir[n].size = uVar8;
    uVar1 = plVar2[n].sizemax;
    if (((uVar1 != 0) && (s[(sVar5 << 0x20) + -0x100000000 >> 0x20] == '\n')) &&
       (uVar1 - linemax <= uVar8)) {
      rotate(plVar2 + n);
    }
    return iVar3;
  }
  piVar6 = __errno_location();
  iVar3 = *piVar6;
  if (iVar3 != 0x1c) goto LAB_0010415b;
  if (dir[n].nmin < dir[n].nmax) {
    while (iVar3 = fchdir(dir[n].fddir), iVar3 == -1) {
      pause2("unable to change directory, want remove old logfile",dir[n].name);
    }
    oldest[0] = 'A';
    oldest[1] = '\0';
    oldest[0x1b] = '\0';
    while (__dirp = opendir("."), __dirp == (DIR *)0x0) {
      pause2("unable to open directory, want remove old logfile",dir[n].name);
    }
    *piVar6 = 0;
    local_6c = 0;
    while (pdVar7 = readdir(__dirp), pdVar7 != (dirent *)0x0) {
      if (pdVar7->d_name[0] == '@') {
        s_00 = pdVar7->d_name;
        uVar4 = str_len(s_00);
        if (uVar4 == 0x1b) {
          local_6c = local_6c + 1;
          iVar3 = str_diff(s_00,oldest);
          if (iVar3 < 0) {
            byte_copy(oldest,0x1b,s_00);
          }
        }
      }
    }
    if (*piVar6 != 0) {
      warn2("unable to read directory, want remove old logfile",dir[n].name);
    }
    closedir(__dirp);
    *piVar6 = 0x1c;
    if ((dir[n].nmin < (ulong)local_6c) && (oldest[0] == '@')) {
      strerr_warn("svlogd: warning: ","out of disk space, delete: ",dir[n].name,"/",oldest,
                  (char *)0x0,(strerr *)0x0);
      *piVar6 = 0;
      iVar3 = unlink(oldest);
      if (iVar3 == -1) {
        warn2("unable to unlink oldest logfile",dir[n].name);
        *piVar6 = 0x1c;
      }
      while (iVar3 = fchdir(fdwdir), iVar3 == -1) {
        pause1("unable to change to initial working directory");
      }
    }
    iVar3 = *piVar6;
    goto LAB_0010415b;
  }
  goto LAB_00104163;
LAB_0010415b:
  if (iVar3 != 0) {
LAB_00104163:
    pause2("unable to write to current",dir[n].name);
  }
  goto LAB_00103f66;
}

Assistant:

int buffer_pwrite(int n, char *s, unsigned int len) {
  int i;

  if ((dir +n)->sizemax) {
    if ((dir +n)->size >= (dir +n)->sizemax) rotate(dir +n);
    if (len > ((dir +n)->sizemax -(dir +n)->size))
      len =(dir +n)->sizemax -(dir +n)->size;
  }
  while ((i =write((dir +n)->fdcur, s, len)) == -1) {
    if ((errno == ENOSPC) && ((dir +n)->nmin < (dir +n)->nmax)) {
      DIR *d;
      direntry *f;
      char oldest[FMT_PTIME];
      int j =0;

      while (fchdir((dir +n)->fddir) == -1)
        pause2("unable to change directory, want remove old logfile",
               (dir +n)->name);
      oldest[0] ='A'; oldest[1] =oldest[27] =0;
      while (! (d =opendir(".")))
        pause2("unable to open directory, want remove old logfile",
               (dir +n)->name);
      errno =0;
      while ((f =readdir(d)))
        if ((f->d_name[0] == '@') && (str_len(f->d_name) == 27)) {
          ++j;
          if (str_diff(f->d_name, oldest) < 0)
            byte_copy(oldest, 27, f->d_name);
        }
      if (errno) warn2("unable to read directory, want remove old logfile",
                       (dir +n)->name);
      closedir(d);
      errno =ENOSPC;
      if (j > (dir +n)->nmin)
        if (*oldest == '@') {
          strerr_warn5(WARNING, "out of disk space, delete: ", (dir +n)->name,
                       "/", oldest, 0);
          errno =0;
          if (unlink(oldest) == -1) {
            warn2("unable to unlink oldest logfile", (dir +n)->name);
            errno =ENOSPC;
          }
          while (fchdir(fdwdir) == -1)
            pause1("unable to change to initial working directory");
        }
    }
    if (errno) pause2("unable to write to current", (dir +n)->name);
  }

  (dir +n)->size +=i;
  if ((dir +n)->sizemax)
    if (s[i -1] == '\n')
      if ((dir +n)->size >= ((dir +n)->sizemax -linemax)) rotate(dir +n);
  return(i);
}